

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgproc.cpp
# Opt level: O1

void enhanceContrastLinearly
               (Image *src,Histogram *src_hist,Image *dest,int low,int high,int channel)

{
  int iVar1;
  byte bVar2;
  domain_error *this;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  if (((src == (Image *)0x0) || (src_hist == (Histogram *)0x0)) || (dest == (Image *)0x0)) {
    __assert_fail("(src != nullptr) && (src_hist != nullptr) && (dest != nullptr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/acstud[P]lab2/src/baseline/imgproc.cpp"
                  ,0x58,
                  "void enhanceContrastLinearly(const Image *, const Histogram *, Image *, int, int, int)"
                 );
  }
  if ((src->width == dest->width) && (src->height == dest->height)) {
    if ((uint)channel < 4) {
      iVar1 = src_hist->range;
      if (iVar1 < 1) {
        bVar2 = 0;
        uVar8 = 0;
      }
      else {
        uVar8 = 0;
        bVar2 = 0;
        do {
          if (low < (src_hist->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar1 * channel + uVar8]) break;
          bVar2 = bVar2 + 1;
          uVar8 = (uint)bVar2;
        } while ((int)uVar8 < iVar1);
      }
      if (bVar2 == 0xff) {
        uVar4 = 0xff;
        bVar3 = 0xff;
      }
      else {
        uVar4 = 0xff;
        do {
          if (high < (src_hist->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)(iVar1 * channel + uVar4)]) {
            bVar3 = (byte)uVar4;
            goto LAB_001128f6;
          }
          uVar4 = uVar4 - 1;
        } while (bVar2 < (byte)uVar4);
        uVar4 = uVar4 & 0xff;
        bVar3 = bVar2;
      }
LAB_001128f6:
      if (src->height != 0) {
        uVar5 = (ulong)(uint)channel;
        uVar6 = 0;
        do {
          uVar9 = src->width;
          if (uVar9 != 0) {
            uVar7 = 0;
            do {
              if (src->height <= uVar6) {
                __assert_fail("(x < width) && (y < height)",
                              "/workspace/llm4binary/github/license_c_cmakelists/acstud[P]lab2/src/baseline/../utils/Image.hpp"
                              ,0x33,"Pixel Image::operator()(int, int) const");
              }
              local_1c = *(undefined4 *)src->pixels[uVar9 * uVar6 + uVar7].colors;
              if (*(byte *)((long)&local_1c + uVar5) < bVar2) {
                if ((dest->width <= uVar7) || (dest->height <= uVar6)) goto LAB_00112a1b;
                dest->pixels[dest->width * uVar6 + uVar7].colors[uVar5] = '\0';
              }
              else {
                local_20 = local_1c;
                if (bVar3 < *(byte *)((long)&local_20 + uVar5)) {
                  if ((dest->width <= uVar7) || (dest->height <= uVar6)) {
LAB_00112a1b:
                    __assert_fail("(x < width) && (y < height)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/acstud[P]lab2/src/baseline/../utils/Image.hpp"
                                  ,0x3e,"Pixel &Image::operator()(int, int)");
                  }
                  dest->pixels[dest->width * uVar6 + uVar7].colors[uVar5] = 0xff;
                }
                else {
                  local_24 = local_1c;
                  if ((dest->width <= uVar7) || (dest->height <= uVar6)) goto LAB_00112a1b;
                  dest->pixels[dest->width * uVar6 + uVar7].colors[uVar5] =
                       (uchar)(int)((float)(int)(*(byte *)((long)&local_24 + uVar5) - uVar8) * 255.0
                                   * (1.0 / (float)(int)(uVar4 - uVar8)));
                }
              }
              uVar7 = uVar7 + 1;
              uVar9 = src->width;
            } while (uVar7 < uVar9);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < src->height);
      }
      return;
    }
    this = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error(this,"Color channel must be 0,1,2 or 3.");
  }
  else {
    this = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error
              (this,"Source and destination image are not of equal dimensions.");
  }
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void enhanceContrastLinearly(const Image *src, const Histogram *src_hist, Image *dest, int low, int high, int channel) {
  // Check arguments
  assert((src != nullptr) && (src_hist != nullptr) && (dest != nullptr));
  checkDimensionsEqualOrThrow(src, dest);
  checkValidColorChannelOrThrow(channel);

  unsigned char first = 0;
  unsigned char last = 255;

  // Obtain the first intensity that is above the threshold.
  for (first = 0; first < src_hist->range; first++) {
    if (src_hist->count(first, channel) > low) {
      break;
    }
  }

  // Obtain the first intensity that is above the threshold.
  for (last = 255; last > first; last--) {
    if (src_hist->count(last, channel) > high) {
      break;
    }
  }

  // Obtain the scaling factor and offset.
  float scale = 255.0f / (last - first);
  auto offset = first;

  // For every pixel
  for (int y = 0; y < src->height; y++) {
    for (int x = 0; x < src->width; x++) {
      // Clamp anything above and below the threshold to 0...255
      if (src->pixel(x, y).colors[channel] < first) {
        dest->pixel(x, y).colors[channel] = 0;
      } else if (src->pixel(x, y).colors[channel] > last) {
        dest->pixel(x, y).colors[channel] = 255;
      } else {
        // Anything else is scaled
        dest->pixel(x, y).colors[channel] = (unsigned char) (scale * (src->pixel(x, y).colors[channel] - offset));
      }
    }
  }

}